

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexTestTest.cpp
# Opt level: O2

void __thiscall RegexTestTest::RegexTestTest(RegexTestTest *this)

{
  allocator<char> local_a9;
  shared_ptr<oout::StringText> local_a8;
  shared_ptr<oout::StringText> local_98;
  char local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  shared_ptr<oout::NamedTest> local_68;
  char local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<oout::NamedTest> local_38;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"RegexTest test",&local_a9)
  ;
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])local_58);
  std::make_unique<oout::RegexTest,std::shared_ptr<oout::StringText>,char_const(&)[5]>
            (&local_98,(char (*) [5])local_58);
  std::make_unique<TestText,std::unique_ptr<oout::RegexTest,std::default_delete<oout::RegexTest>>>
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)
             &local_98.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_48,
             (char (*) [8])
             &local_98.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest,char_const(&)[29],std::shared_ptr<oout::EqualTest>>
            ((char (*) [29])&local_38,(shared_ptr<oout::EqualTest> *)"RegexTest success if matched")
  ;
  std::make_shared<oout::StringText,char_const(&)[5]>((char (*) [5])local_88);
  std::make_unique<oout::RegexTest,std::shared_ptr<oout::StringText>,char_const(&)[4]>
            (&local_a8,(char (*) [4])local_88);
  std::make_unique<TestText,std::unique_ptr<oout::RegexTest,std::default_delete<oout::RegexTest>>>
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)
             &local_a8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_78,
             (char (*) [8])
             &local_a8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<oout::NamedTest,char_const(&)[31],std::shared_ptr<oout::EqualTest>>
            ((char (*) [31])&local_68,
             (shared_ptr<oout::EqualTest> *)"RegexTest failure if not match");
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_28,&local_38,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_a8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_>::~unique_ptr
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)
             &local_98.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_>::~unique_ptr
            ((unique_ptr<oout::RegexTest,_std::default_delete<oout::RegexTest>_> *)&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cc7f8;
  return;
}

Assistant:

RegexTestTest::RegexTestTest()
: dirty::Test(
	"RegexTest test",
	make_shared<NamedTest>(
		"RegexTest success if matched",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<RegexTest>(
					make_shared<StringText>("test"),
					"t.+t"
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"RegexTest failure if not match",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<RegexTest>(
					make_shared<StringText>("test"),
					R"(\d+)"
				)
			),
			"failure"
		)
	)
)
{
}